

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O2

int AnalyseBufHdrHexBinLenSeanet(uchar *buf,int buflen,int *pExpectedMsgLen)

{
  uint uVar1;
  int iVar2;
  
  iVar2 = 1;
  if ((6 < buflen) && (*buf == '@')) {
    uVar1 = GetHexLengthSeanet(buf);
    if (uVar1 == *(ushort *)(buf + 5)) {
      *pExpectedMsgLen = uVar1 + 6;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

inline int AnalyseBufHdrHexBinLenSeanet(unsigned char* buf, int buflen, int* pExpectedMsgLen)
{
	int HexLength = 0;

	if (buflen < 7)
	{
		//PRINT_DEBUG_MESSAGE_SEANETCORE(("Invalid number of bytes\n"));
		return EXIT_FAILURE;
	}
	if (buf[0] != MESSAGE_HEADER_SEANET)
	{
		//PRINT_DEBUG_MESSAGE_SEANETCORE(("Invalid message header\n"));
		return EXIT_FAILURE;
	}
	HexLength = GetHexLengthSeanet(buf);
	if (HexLength != GetBinLengthSeanet(buf))
	{
		//PRINT_DEBUG_MESSAGE_SEANETCORE(("Invalid Hex or Bin Length\n"));
		return EXIT_FAILURE;
	}

	*pExpectedMsgLen = HexLength+6;

	return EXIT_SUCCESS;
}